

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline.cpp
# Opt level: O2

StringList * __thiscall
CommandLine::process(StringList *__return_storage_ptr__,CommandLine *this,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  CommandLineOption **ppCVar3;
  CommandLineOption *pCVar4;
  int iVar5;
  long lVar6;
  String value;
  String name;
  String arg;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  String local_70;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  std::_Deque_base<String,_std::allocator<String>_>::_Deque_base
            ((_Deque_base<String,_std::allocator<String>_> *)__return_storage_ptr__);
  iVar5 = 1;
  do {
    if (argc <= iVar5) {
      return __return_storage_ptr__;
    }
    lVar6 = (long)iVar5;
    String::String(&arg,argv[lVar6]);
    bVar1 = String::operator==(&arg,"--");
    if (bVar1) {
      while (lVar6 = lVar6 + 1, lVar6 < argc) {
        String::String(&name,argv[lVar6]);
        List<String>::append(&__return_storage_ptr__->super_List<String>,&name);
        std::__cxx11::string::~string((string *)&name);
      }
      std::__cxx11::string::~string((string *)&arg);
      return __return_storage_ptr__;
    }
    if (*arg._string._M_dataplus._M_p == '-') {
      if (arg._string._M_dataplus._M_p[1] == '-') {
        name._string._M_dataplus._M_p = (pointer)&name._string.field_2;
        name._string._M_string_length = 0;
        name._string.field_2._M_local_buf[0] = '\0';
        value._string._M_dataplus._M_p = (pointer)&value._string.field_2;
        value._string._M_string_length = 0;
        value._string.field_2._M_local_buf[0] = '\0';
        iVar2 = String::firstIndexOf(&arg,"=",2);
        if (iVar2 == -1) {
          String::mid(&local_70,&arg,2,-1);
          std::__cxx11::string::operator=((string *)&name,(string *)&local_70);
        }
        else {
          String::mid(&local_70,&arg,2,(long)iVar2);
          std::__cxx11::string::operator=((string *)&name,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          String::mid(&local_70,&arg,(long)(iVar2 + 1),-1);
          std::__cxx11::string::operator=((string *)&value,(string *)&local_70);
        }
        std::__cxx11::string::~string((string *)&local_70);
        local_90._8_8_ = 0;
        local_78 = std::
                   _Function_handler<bool_(CommandLineOption_*const_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/commandline.cpp:123:51)>
                   ::_M_invoke;
        local_80 = std::
                   _Function_handler<bool_(CommandLineOption_*const_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/commandline.cpp:123:51)>
                   ::_M_manager;
        local_90._M_unused._0_8_ = (string *)&name;
        ppCVar3 = List<CommandLineOption_*>::find
                            (&this->_options,
                             (function<bool_(CommandLineOption_*const_&)> *)&local_90);
        std::_Function_base::~_Function_base((_Function_base *)&local_90);
        if (ppCVar3 == (CommandLineOption **)0x0) {
          error<String>("unknown option --%1",&name);
        }
        pCVar4 = *ppCVar3;
        if ((pCVar4->_type == (type_info *)&bool::typeinfo) &&
           (*value._string._M_dataplus._M_p != '\0')) {
          CommandLineOption::describe(&local_70,pCVar4);
          error<String>("option %1 does not take a value",&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          pCVar4 = *ppCVar3;
        }
        (*pCVar4->_vptr_CommandLineOption[2])(pCVar4,&value);
        std::__cxx11::string::~string((string *)&value);
        std::__cxx11::string::~string((string *)&name);
      }
      else {
        if (arg._string._M_dataplus._M_p[1] == '\0') goto LAB_00117de5;
        iVar2 = 1;
        while( true ) {
          value._string._M_dataplus._M_p._0_4_ = iVar2;
          if ((int)arg._string._M_string_length <= iVar2) break;
          local_50._8_8_ = &value;
          local_38 = std::
                     _Function_handler<bool_(CommandLineOption_*const_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/commandline.cpp:74:52)>
                     ::_M_invoke;
          local_40 = std::
                     _Function_handler<bool_(CommandLineOption_*const_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/commandline.cpp:74:52)>
                     ::_M_manager;
          local_50._M_unused._0_8_ = (undefined8)(string *)&arg;
          ppCVar3 = List<CommandLineOption_*>::find
                              (&this->_options,
                               (function<bool_(CommandLineOption_*const_&)> *)&local_50);
          std::_Function_base::~_Function_base((_Function_base *)&local_50);
          if (ppCVar3 == (CommandLineOption **)0x0) {
            error<char>("unknown option -%1",
                        arg._string._M_dataplus._M_p + (int)value._string._M_dataplus._M_p);
          }
          pCVar4 = *ppCVar3;
          if (pCVar4->_type == (type_info *)&bool::typeinfo) {
            String::String(&name,"");
            (*pCVar4->_vptr_CommandLineOption[2])(pCVar4,(string *)&name);
          }
          else {
            if (iVar5 == argc + -1) {
              CommandLineOption::describe(&name,pCVar4);
              error<String>("option -%1 requires a parameter",&name);
              std::__cxx11::string::~string((string *)&name);
            }
            if ((int)value._string._M_dataplus._M_p != (int)arg._string._M_string_length + -1) {
              CommandLineOption::describe(&name,pCVar4);
              error<String,char>("option %1 requires a parameter but has option -%2 stacked on",
                                 &name,arg._string._M_dataplus._M_p +
                                       (long)(int)value._string._M_dataplus._M_p + 1);
              std::__cxx11::string::~string((string *)&name);
            }
            String::String(&name,argv[(long)iVar5 + 1]);
            (*pCVar4->_vptr_CommandLineOption[2])(pCVar4,(string *)&name);
            iVar5 = iVar5 + 1;
          }
          std::__cxx11::string::~string((string *)&name);
          iVar2 = (int)value._string._M_dataplus._M_p + 1;
        }
      }
    }
    else {
LAB_00117de5:
      List<String>::append(&__return_storage_ptr__->super_List<String>,&arg);
    }
    std::__cxx11::string::~string((string *)&arg);
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

StringList CommandLine::process (int const argc, char* argv[])
{
	StringList args;

	for (int argn = 1; argn < argc; ++argn)
	{
		String const arg (argv[argn]);

		if (arg == "--")
		{
			// terminating option - write everything to args and be done with it.
			while (++argn < argc)
				args << argv[argn];

			break;
		}

		if (arg[0] != '-' or arg[1] == '\0')
		{
			// non-option argument - pass to result
			args << arg;
			continue;
		}

		if (arg[1] != '-' and arg[1] != '\0')
		{
			// short-form options
			for (int i = 1; i < arg.length(); ++i)
			{
				CommandLineOption** optionptr = _options.find ([&](CommandLineOption* const& a)
				{
					return arg[i] == a->shortform();
				});

				if (not optionptr)
					error ("unknown option -%1", arg[i]);

				CommandLineOption* option = *optionptr;

				if (option->isOfType<bool>())
				{
					// Bool options need no parameters
					option->handleValue ("");
				}
				else
				{
					// Ensure we got a valid parameter coming up
					if (argn == argc - 1)
						error ("option -%1 requires a parameter", option->describe());

					if (i != arg.length() - 1)
					{
						error ("option %1 requires a parameter but has option -%2 stacked on",
							option->describe(), arg[i + 1]);
					}

					option->handleValue (argv[++argn]);
				}
			}
		}
		else
		{
			// long-form options
			String name, value;
			{
				int idx = arg.firstIndexOf ("=", 2);

				if (idx != -1)
				{
					name = arg.mid (2, idx);
					value = arg.mid (idx + 1);
				}
				else
				{
					name = arg.mid (2);
				}
			}

			CommandLineOption** optionptr = _options.find ([&](CommandLineOption* const& a)
			{
				return a->longform() == name;
			});

			if (not optionptr)
				error ("unknown option --%1", name);

			if ((*optionptr)->isOfType<bool>() and not value.isEmpty())
				error ("option %1 does not take a value", (*optionptr)->describe());
 
			(*optionptr)->handleValue (value);
		}
	}

	return args;
}